

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

bool __thiscall Bstrlib::CBString::operator<=(CBString *this,CBString *b)

{
  int iVar1;
  CBStringException *this_00;
  CBStringException bstr__cppwrapper_exception;
  string local_58;
  CBStringException local_38;
  
  iVar1 = bstrcmp(&this->super_tagbstring,&b->super_tagbstring);
  if (iVar1 != -0x8000) {
    return iVar1 < 1;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"CBString::Failure in compare (<=)","");
  CBStringException::CBStringException(&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&local_38);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

bool CBString::operator <= (const CBString& b) const {
	int retval;
	if (SHRT_MIN == (retval = bstrcmp ((bstring) this, (bstring)&b))) {
		bstringThrow ("Failure in compare (<=)");
	}
	return retval <= 0;
}